

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteTypes(WatWriter *this,TypeVector *types,char *name)

{
  pointer pTVar1;
  pointer pTVar2;
  
  pTVar1 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar2 != pTVar1) {
    if (name != (char *)0x0) {
      WriteOpenSpace(this,name);
      pTVar1 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    for (; pTVar1 != pTVar2; pTVar1 = pTVar1 + 1) {
      WriteType(this,(Type)pTVar1->enum_,Space);
    }
    if (name != (char *)0x0) {
      WriteCloseSpace(this);
      return;
    }
  }
  return;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnTernaryExpr(TernaryExpr* expr) {
  writer_->WritePutsNewline(expr->opcode.GetName());
  return Result::Ok;
}